

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::prepareDrawShaderSource
          (LengthOfVectorAndMatrixTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  uint uVar1;
  pointer ptVar2;
  pointer psVar3;
  size_t sVar4;
  GLchar *pGVar5;
  undefined8 extraout_RAX;
  TestError *this_00;
  char *pcVar6;
  char *pcVar7;
  size_t position;
  undefined4 local_17c;
  qualifierSet out_qualifiers;
  qualifierSet in_qualifiers;
  long *local_138 [2];
  long local_128 [2];
  string output_ref;
  string output_decl;
  string input_ref;
  string input_decl;
  long *local_98 [2];
  long local_88 [2];
  bool *local_78;
  string local_70;
  string local_50;
  
  uVar1 = this->m_current_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar5 = Utils::getTypeName(ptVar2[uVar1].m_type,1,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,pGVar5,(allocator<char> *)&local_50);
  getExpectedValue_abi_cxx11_(&local_50,this,in_stage);
  getInitialization_abi_cxx11_(&local_70,this);
  ptVar2 = ptVar2 + uVar1;
  pGVar5 = Utils::getTypeName(ptVar2->m_type,ptVar2->m_n_cols,ptVar2->m_n_rows);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,pGVar5,(allocator<char> *)&input_decl);
  input_decl._M_dataplus._M_p = (pointer)&input_decl.field_2;
  input_decl._M_string_length = 0;
  input_decl.field_2._M_local_buf[0] = '\0';
  input_ref._M_dataplus._M_p = (pointer)&input_ref.field_2;
  input_ref._M_string_length = 0;
  input_ref.field_2._M_local_buf[0] = '\0';
  output_decl._M_dataplus._M_p = (pointer)&output_decl.field_2;
  output_decl._M_string_length = 0;
  output_decl.field_2._M_local_buf[0] = '\0';
  output_ref._M_dataplus._M_p = (pointer)&output_ref.field_2;
  output_ref._M_string_length = 0;
  output_ref.field_2._M_local_buf[0] = '\0';
  in_qualifiers.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_qualifiers.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_qualifiers.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  out_qualifiers.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out_qualifiers.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  out_qualifiers.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((ptVar2->m_type & ~DOUBLE) == INT) {
    if (in_stage == VERTEX_SHADER) {
      position = CONCAT44(position._4_4_,9);
    }
    else {
      position = CONCAT44(position._4_4_,9);
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
                (&in_qualifiers,(iterator)0x0,(QUALIFIERS *)&position);
      position = CONCAT44(position._4_4_,9);
      if (out_qualifiers.
          super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          out_qualifiers.
          super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        *out_qualifiers.
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         ._M_impl.super__Vector_impl_data._M_finish = QUAL_FLAT;
        out_qualifiers.
        super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             out_qualifiers.
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        goto LAB_009e1b17;
      }
    }
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>
              (&out_qualifiers,
               (iterator)
               out_qualifiers.
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data._M_finish,(QUALIFIERS *)&position);
  }
LAB_009e1b17:
  switch(in_stage) {
  case COMPUTE_SHADER:
    pcVar7 = (char *)0x0;
    break;
  case VERTEX_SHADER:
    Utils::prepareVariableStrings
              (VERTEX_SHADER,INPUT,&in_qualifiers,(GLchar *)local_138[0],"variable",&input_decl,
               &input_ref);
    pcVar7 = 
    "VERSION\n\nout vec4 vs_tcs_result;\n\nin VARIABLE_DECLARATION;\nout VSOutputBlock {\n    VARIABLE_DECLARATION;\n} output_block;\n\nstruct Structure {\n    vec4 member_a;\n    TYPE_NAME member_b;\n};\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION\n    vs_tcs_result = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n}\n\n"
    ;
    goto LAB_009e1c0b;
  case TESS_CTRL_SHADER:
    pcVar7 = 
    "VERSION\n\nlayout(vertices = 1) out;\n\nin  vec4 vs_tcs_result[];\nout vec4 tcs_tes_result[];\n\nin VSOutputBlock {\n    VARIABLE_DECLARATION;\n} input_block[];\nout TCSOutputBlock {\n    VARIABLE_DECLARATION;\n} output_block[];\n\nstruct Structure {\n    vec4 member_a;\n    TYPE_NAME member_b;\n};\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    tcs_tes_result[gl_InvocationID] = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n}\n\n"
    ;
    break;
  case TESS_EVAL_SHADER:
    pcVar7 = 
    "VERSION\n\nlayout(isolines, point_mode) in;\n\nin  vec4 tcs_tes_result[];\nout vec4 tes_gs_result;\n\nin TCSOutputBlock {\n    VARIABLE_DECLARATION;\n} input_block[];\nout TCSOutputBlock {\n    VARIABLE_DECLARATION;\n} output_block;\n\nstruct Structure {\n    vec4 member_a;\n    TYPE_NAME member_b;\n};\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    tes_gs_result = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n}\n\n"
    ;
    break;
  case GEOMETRY_SHADER:
    pcVar7 = 
    "VERSION\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nin  vec4 tes_gs_result[];\nout vec4 gs_fs_result;\n\nin TCSOutputBlock {\n    VARIABLE_DECLARATION;\n} input_block[];\nout GSOutputBlock {\n    VARIABLE_DECLARATION;\n} output_block;\n\nstruct Structure {\n    vec4 member_a;\n    TYPE_NAME member_b;\n};\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    gs_fs_result  = result;\n    gl_Position   = vec4(-1, -1, 0, 1);\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n    EmitVertex();\n    gs_fs_result  = result;\n    gl_Position   = vec4(-1, 1, 0, 1);\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n    EmitVertex();\n    gs_fs_result  = result;\n    gl_Position   = vec4(1, -1, 0, 1);\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n    EmitVertex();\n    gs_fs_result  = result;\n    gl_Position   = vec4(1, 1, 0, 1);\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n    EmitVertex();\n}\n\n"
    ;
    break;
  case FRAGMENT_SHADER:
    pcVar7 = 
    "VERSION\n\n#define FRAGMENT\n\nin  vec4 gs_fs_result;\nout vec4 fs_out_result;\n\nin GSOutputBlock {\n    VARIABLE_DECLARATION;\n} input_block;\n\nstruct Structure {\n    vec4 member_a;\n    TYPE_NAME member_b;\n};\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    fs_out_result = result;\n}\n\n"
    ;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3e46);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  Utils::prepareBlockVariableStrings
            (in_stage,INPUT,&in_qualifiers,(GLchar *)local_138[0],"variable","input_block",
             &input_decl,&input_ref);
  if (in_stage == FRAGMENT_SHADER) {
    local_17c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    Utils::prepareVariableStrings
              (FRAGMENT_SHADER,OUTPUT,&out_qualifiers,(GLchar *)local_138[0],"variable",&output_decl
               ,&output_ref);
  }
  else {
LAB_009e1c0b:
    Utils::prepareBlockVariableStrings
              (in_stage,OUTPUT,&out_qualifiers,(GLchar *)local_138[0],"variable","output_block",
               &output_decl,&output_ref);
    local_17c = 0;
  }
  local_78 = (bool *)0x1a8cf33;
  if (ptVar2->m_n_cols == 1) {
    local_78 = glcts::fixed_sample_locations_values + 1;
  }
  psVar3 = (out_source->m_parts).
           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar6 = (char *)(psVar3->m_code)._M_string_length;
  strlen(pcVar7);
  std::__cxx11::string::_M_replace((ulong)psVar3,0,pcVar6,(ulong)pcVar7);
  position = 0;
  pcVar7 = "#version 420";
  if (in_use_version_400) {
    pcVar7 = 
    "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
    ;
  }
  pcVar6 = "#version 430";
  if (in_stage != COMPUTE_SHADER) {
    pcVar6 = pcVar7;
  }
  Utils::replaceToken("VERSION",&position,pcVar6,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("VARIABLE_DECLARATION",&position,input_decl._M_dataplus._M_p,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  if ((char)local_17c == '\0') {
    Utils::replaceToken("VARIABLE_DECLARATION",&position,output_decl._M_dataplus._M_p,
                        &((out_source->m_parts).
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_code);
  }
  Utils::replaceToken("TYPE_NAME",&position,(GLchar *)local_138[0],
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  sVar4 = position;
  Utils::replaceToken("VERIFICATION",&position,
                      "    VARIABLE_TYPE variable  = INITIALIZATION;\n    Structure     structure = { { 0, 1, 0, 1 } , INITIALIZATION };\n\n    const uint variable_length           = variable.length();\n    const uint structure_member_b_length = structure.member_b.length();\n    const uint input_member_length       = INPUT_VARIABLE_NAME.length();\n#ifndef FRAGMENT\n    const uint output_member_length      = OUTPUT_VARIABLE_NAME.length();\n#endif // FRAGMENT\n\n    BASE_TYPE array_var[variable.length()];\n    BASE_TYPE array_str[structure.member_b.length()];\n    BASE_TYPE array_in [INPUT_VARIABLE_NAME.length()];\n#ifndef FRAGMENT\n    BASE_TYPE array_out[OUTPUT_VARIABLE_NAME.length()];\n#endif // FRAGMENT\n\n    BASE_TYPE sum = 0;\n\n    for (uint i = 0; i < variable_length; ++i)\n    {\n        array_var[i] = variableARRAY_INDEX.x;\n    }\n\n    for (uint i = 0; i < structure_member_b_length; ++i)\n    {\n        array_str[i] = structure.member_bARRAY_INDEX.y;\n    }\n\n    for (uint i = 0; i < input_member_length; ++i)\n    {\n        array_in[i]  = INPUT_VARIABLE_NAMEARRAY_INDEX.x;\n    }\n\n#ifndef FRAGMENT\n    for (uint i = 0; i < output_member_length; ++i)\n    {\n        array_out[i] = INPUT_VARIABLE_NAMEARRAY_INDEX.y;\n    }\n#endif // FRAGMENT\n\n    for (uint i = 0; i < array_var.length(); ++i)\n    {\n         sum += array_var[i];\n    }\n\n    for (uint i = 0; i < array_str.length(); ++i)\n    {\n         sum += array_str[i];\n    }\n\n    for (uint i = 0; i < array_in.length(); ++i)\n    {\n         sum += array_in[i];\n    }\n\n#ifndef FRAGMENT\n    for (uint i = 0; i < array_out.length(); ++i)\n    {\n         sum += array_out[i];\n    }\n#endif // FRAGMENT\n\n    if (EXPECTED_VALUE != sum)\n    {\n        result = vec4(1, 0, 0, 1);\n    }\n"
                      ,&((out_source->m_parts).
                         super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_code);
  position = sVar4;
  Utils::replaceToken("VARIABLE_TYPE",&position,(GLchar *)local_138[0],
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("INITIALIZATION",&position,local_70._M_dataplus._M_p,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("INITIALIZATION",&position,local_70._M_dataplus._M_p,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("BASE_TYPE",&position,(GLchar *)local_98[0],
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("BASE_TYPE",&position,(GLchar *)local_98[0],
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("BASE_TYPE",&position,(GLchar *)local_98[0],
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("BASE_TYPE",&position,(GLchar *)local_98[0],
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("BASE_TYPE",&position,(GLchar *)local_98[0],
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("EXPECTED_VALUE",&position,local_50._M_dataplus._M_p,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceAllTokens
            ("INPUT_VARIABLE_NAME",input_ref._M_dataplus._M_p,
             &((out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceAllTokens
            ("OUTPUT_VARIABLE_NAME",output_ref._M_dataplus._M_p,
             &((out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceAllTokens
            ("ARRAY_INDEX",local_78,
             &((out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_code);
  if (out_qualifiers.
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(out_qualifiers.
                    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)out_qualifiers.
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)out_qualifiers.
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (in_qualifiers.
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(in_qualifiers.
                    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)in_qualifiers.
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)in_qualifiers.
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output_ref._M_dataplus._M_p != &output_ref.field_2) {
    operator_delete(output_ref._M_dataplus._M_p,
                    CONCAT71(output_ref.field_2._M_allocated_capacity._1_7_,
                             output_ref.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output_decl._M_dataplus._M_p != &output_decl.field_2) {
    operator_delete(output_decl._M_dataplus._M_p,
                    CONCAT71(output_decl.field_2._M_allocated_capacity._1_7_,
                             output_decl.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_ref._M_dataplus._M_p != &input_ref.field_2) {
    operator_delete(input_ref._M_dataplus._M_p,
                    CONCAT71(input_ref.field_2._M_allocated_capacity._1_7_,
                             input_ref.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_decl._M_dataplus._M_p != &input_decl.field_2) {
    operator_delete(input_decl._M_dataplus._M_p,
                    CONCAT71(input_decl.field_2._M_allocated_capacity._1_7_,
                             input_decl.field_2._M_local_buf[0]) + 1);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  return;
}

Assistant:

void LengthOfVectorAndMatrixTest::prepareDrawShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
														  Utils::shaderSource& out_source)
{
	static const GLchar* verification_snippet =
		"    VARIABLE_TYPE variable  = INITIALIZATION;\n"
		"    Structure     structure = { { 0, 1, 0, 1 } , INITIALIZATION };\n"
		"\n"
		"    const uint variable_length           = variable.length();\n"
		"    const uint structure_member_b_length = structure.member_b.length();\n"
		"    const uint input_member_length       = INPUT_VARIABLE_NAME.length();\n"
		"#ifndef FRAGMENT\n"
		"    const uint output_member_length      = OUTPUT_VARIABLE_NAME.length();\n"
		"#endif // FRAGMENT\n"
		"\n"
		"    BASE_TYPE array_var[variable.length()];\n"
		"    BASE_TYPE array_str[structure.member_b.length()];\n"
		"    BASE_TYPE array_in [INPUT_VARIABLE_NAME.length()];\n"
		"#ifndef FRAGMENT\n"
		"    BASE_TYPE array_out[OUTPUT_VARIABLE_NAME.length()];\n"
		"#endif // FRAGMENT\n"
		"\n"
		"    BASE_TYPE sum = 0;\n"
		"\n"
		"    for (uint i = 0; i < variable_length; ++i)\n"
		"    {\n"
		"        array_var[i] = variableARRAY_INDEX.x;\n"
		"    }\n"
		"\n"
		"    for (uint i = 0; i < structure_member_b_length; ++i)\n"
		"    {\n"
		"        array_str[i] = structure.member_bARRAY_INDEX.y;\n"
		"    }\n"
		"\n"
		"    for (uint i = 0; i < input_member_length; ++i)\n"
		"    {\n"
		"        array_in[i]  = INPUT_VARIABLE_NAMEARRAY_INDEX.x;\n"
		"    }\n"
		"\n"
		"#ifndef FRAGMENT\n"
		"    for (uint i = 0; i < output_member_length; ++i)\n"
		"    {\n"
		"        array_out[i] = INPUT_VARIABLE_NAMEARRAY_INDEX.y;\n"
		"    }\n"
		"#endif // FRAGMENT\n"
		"\n"
		"    for (uint i = 0; i < array_var.length(); ++i)\n"
		"    {\n"
		"         sum += array_var[i];\n"
		"    }\n"
		"\n"
		"    for (uint i = 0; i < array_str.length(); ++i)\n"
		"    {\n"
		"         sum += array_str[i];\n"
		"    }\n"
		"\n"
		"    for (uint i = 0; i < array_in.length(); ++i)\n"
		"    {\n"
		"         sum += array_in[i];\n"
		"    }\n"
		"\n"
		"#ifndef FRAGMENT\n"
		"    for (uint i = 0; i < array_out.length(); ++i)\n"
		"    {\n"
		"         sum += array_out[i];\n"
		"    }\n"
		"#endif // FRAGMENT\n"
		"\n"
		"    if (EXPECTED_VALUE != sum)\n"
		"    {\n"
		"        result = vec4(1, 0, 0, 1);\n"
		"    }\n";

	static const GLchar* fragment_shader_template = "VERSION\n"
													"\n"
													"#define FRAGMENT\n"
													"\n"
													"in  vec4 gs_fs_result;\n"
													"out vec4 fs_out_result;\n"
													"\n"
													"in GSOutputBlock {\n"
													"    VARIABLE_DECLARATION;\n"
													"} input_block;\n"
													"\n"
													"struct Structure {\n"
													"    vec4 member_a;\n"
													"    TYPE_NAME member_b;\n"
													"};\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    fs_out_result = result;\n"
													"}\n"
													"\n";

	static const GLchar* geometry_shader_template = "VERSION\n"
													"\n"
													"layout(points)                           in;\n"
													"layout(triangle_strip, max_vertices = 4) out;\n"
													"\n"
													"in  vec4 tes_gs_result[];\n"
													"out vec4 gs_fs_result;\n"
													"\n"
													"in TCSOutputBlock {\n"
													"    VARIABLE_DECLARATION;\n"
													"} input_block[];\n"
													"out GSOutputBlock {\n"
													"    VARIABLE_DECLARATION;\n"
													"} output_block;\n"
													"\n"
													"struct Structure {\n"
													"    vec4 member_a;\n"
													"    TYPE_NAME member_b;\n"
													"};\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(-1, -1, 0, 1);\n"
													"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													"    EmitVertex();\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(-1, 1, 0, 1);\n"
													"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													"    EmitVertex();\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(1, -1, 0, 1);\n"
													"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													"    EmitVertex();\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(1, 1, 0, 1);\n"
													"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													"    EmitVertex();\n"
													"}\n"
													"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in  vec4 vs_tcs_result[];\n"
		"out vec4 tcs_tes_result[];\n"
		"\n"
		"in VSOutputBlock {\n"
		"    VARIABLE_DECLARATION;\n"
		"} input_block[];\n"
		"out TCSOutputBlock {\n"
		"    VARIABLE_DECLARATION;\n"
		"} output_block[];\n"
		"\n"
		"struct Structure {\n"
		"    vec4 member_a;\n"
		"    TYPE_NAME member_b;\n"
		"};\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template = "VERSION\n"
													 "\n"
													 "layout(isolines, point_mode) in;\n"
													 "\n"
													 "in  vec4 tcs_tes_result[];\n"
													 "out vec4 tes_gs_result;\n"
													 "\n"
													 "in TCSOutputBlock {\n"
													 "    VARIABLE_DECLARATION;\n"
													 "} input_block[];\n"
													 "out TCSOutputBlock {\n"
													 "    VARIABLE_DECLARATION;\n"
													 "} output_block;\n"
													 "\n"
													 "struct Structure {\n"
													 "    vec4 member_a;\n"
													 "    TYPE_NAME member_b;\n"
													 "};\n"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    vec4 result = vec4(0, 1, 0, 1);\n"
													 "\n"
													 "VERIFICATION"
													 "    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n"
													 "    {\n"
													 "         result = vec4(1, 0, 0, 1);\n"
													 "    }\n"
													 "\n"
													 "    tes_gs_result = result;\n"
													 "    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													 "}\n"
													 "\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "\n"
												  "out vec4 vs_tcs_result;\n"
												  "\n"
												  "in VARIABLE_DECLARATION;\n"
												  "out VSOutputBlock {\n"
												  "    VARIABLE_DECLARATION;\n"
												  "} output_block;\n"
												  "\n"
												  "struct Structure {\n"
												  "    vec4 member_a;\n"
												  "    TYPE_NAME member_b;\n"
												  "};\n"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = vec4(0, 1, 0, 1);\n"
												  "\n"
												  "VERIFICATION"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
												  "}\n"
												  "\n";

	const GLchar*   array_index		  = "";
	const testCase& test_case		  = m_test_cases[m_current_test_case_index];
	const GLchar*   shader_template   = 0;
	const GLchar*   input_block_name  = "input_block";
	const GLchar*   output_block_name = "output_block";

	const std::string& base_type_name = Utils::getTypeName(test_case.m_type, 1 /* cols */, 1 /* rows */);
	const std::string& expected_value = getExpectedValue(in_stage);
	const std::string& initialization = getInitialization();
	const std::string& type_name	  = Utils::getTypeName(test_case.m_type, test_case.m_n_cols, test_case.m_n_rows);

	std::string input_decl;
	std::string input_ref;
	std::string output_decl;
	std::string output_ref;

	Utils::qualifierSet in_qualifiers;
	Utils::qualifierSet out_qualifiers;

	if ((Utils::UINT == test_case.m_type) || (Utils::INT == test_case.m_type))
	{
		if (Utils::VERTEX_SHADER != in_stage)
		{
			in_qualifiers.push_back(Utils::QUAL_FLAT);
		}

		out_qualifiers.push_back(Utils::QUAL_FLAT);
	}

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		shader_template = 0;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	if (Utils::VERTEX_SHADER != in_stage)
	{
		Utils::prepareBlockVariableStrings(in_stage, Utils::INPUT, in_qualifiers, type_name.c_str(), "variable",
										   input_block_name, input_decl, input_ref);
	}
	else
	{
		Utils::prepareVariableStrings(in_stage, Utils::INPUT, in_qualifiers, type_name.c_str(), "variable", input_decl,
									  input_ref);
	}
	if (Utils::FRAGMENT_SHADER != in_stage)
	{
		Utils::prepareBlockVariableStrings(in_stage, Utils::OUTPUT, out_qualifiers, type_name.c_str(), "variable",
										   output_block_name, output_decl, output_ref);
	}
	else
	{
		Utils::prepareVariableStrings(in_stage, Utils::OUTPUT, out_qualifiers, type_name.c_str(), "variable",
									  output_decl, output_ref);
	}

	if (1 != test_case.m_n_cols)
	{
		array_index = "[i]";
	}

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;
	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceToken("VARIABLE_DECLARATION", position, input_decl.c_str(), out_source.m_parts[0].m_code);

	if (Utils::FRAGMENT_SHADER != in_stage)
	{
		Utils::replaceToken("VARIABLE_DECLARATION", position, output_decl.c_str(), out_source.m_parts[0].m_code);
	}

	Utils::replaceToken("TYPE_NAME", position, type_name.c_str(), out_source.m_parts[0].m_code);

	size_t temp = position;

	Utils::replaceToken("VERIFICATION", position, verification_snippet, out_source.m_parts[0].m_code);

	position = temp;

	Utils::replaceToken("VARIABLE_TYPE", position, type_name.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("INITIALIZATION", position, initialization.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("INITIALIZATION", position, initialization.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("BASE_TYPE", position, base_type_name.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("BASE_TYPE", position, base_type_name.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("BASE_TYPE", position, base_type_name.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("BASE_TYPE", position, base_type_name.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("BASE_TYPE", position, base_type_name.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("EXPECTED_VALUE", position, expected_value.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("INPUT_VARIABLE_NAME", input_ref.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("OUTPUT_VARIABLE_NAME", output_ref.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("ARRAY_INDEX", array_index, out_source.m_parts[0].m_code);
}